

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::Matcher<const_wchar_t_*>::Matcher(Matcher<const_wchar_t_*> *this,wchar_t *value)

{
  MatcherBase<const_wchar_t_*> local_30;
  wchar_t *local_18;
  
  (this->super_MatcherBase<const_wchar_t_*>).impl_.value_ = (MatcherInterface<const_wchar_t_*> *)0x0
  ;
  (this->super_MatcherBase<const_wchar_t_*>).impl_.link_.next_ =
       &(this->super_MatcherBase<const_wchar_t_*>).impl_.link_;
  (this->super_MatcherBase<const_wchar_t_*>)._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001bab98;
  local_18 = value;
  internal::EqMatcher::operator_cast_to_Matcher
            ((Matcher<const_wchar_t_*> *)&local_30,(EqMatcher *)&local_18);
  internal::linked_ptr<const_testing::MatcherInterface<const_wchar_t_*>_>::operator=
            (&(this->super_MatcherBase<const_wchar_t_*>).impl_,&local_30.impl_);
  internal::MatcherBase<const_wchar_t_*>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }